

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O1

bool __thiscall cmDocumentation::PrintHelpOneVariable(cmDocumentation *this,ostream *os)

{
  pointer pcVar1;
  bool bVar2;
  ostream *poVar3;
  cmDocumentation *this_00;
  string vname;
  undefined1 local_88 [32];
  string local_68;
  string local_48;
  
  this_00 = (cmDocumentation *)local_88;
  pcVar1 = (this->CurrentArgument)._M_dataplus._M_p;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,pcVar1 + (this->CurrentArgument)._M_string_length);
  cmSystemTools::HelpFileName(&local_48,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                 "variable/",&local_48);
  bVar2 = PrintFiles(this_00,os,(string *)local_88);
  if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
    operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
  }
  if (!bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"Argument \"",10);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,(this->CurrentArgument)._M_dataplus._M_p,
                        (this->CurrentArgument)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"\" to --help-variable is not a defined variable.  ",0x31);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"Use --help-variable-list to see all defined variables.\n",0x37);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool cmDocumentation::PrintHelpOneVariable(std::ostream& os)
{
  std::string vname = cmSystemTools::HelpFileName(this->CurrentArgument);
  if (this->PrintFiles(os, "variable/" + vname)) {
    return true;
  }
  // Argument was not a variable.  Complain.
  os << "Argument \"" << this->CurrentArgument
     << "\" to --help-variable is not a defined variable.  "
     << "Use --help-variable-list to see all defined variables.\n";
  return false;
}